

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::UniformCase::UniformCase
          (UniformCase *this,Context *context,char *name,char *description,deUint32 seed)

{
  StructType *this_00;
  pointer pUVar1;
  long *name_;
  UniformCase *pUVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  undefined4 extraout_var;
  UniformCollection *this_01;
  long *plVar6;
  SharedPtrStateBase *pSVar7;
  long *plVar8;
  VarType *type;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> structTypes;
  int structIdx;
  Random rnd;
  Uniform uniform;
  vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> local_278;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  UniformCase *local_238;
  deUint32 local_22c;
  uint local_228;
  int local_224;
  long *local_220 [2];
  long local_210 [2];
  SharedPtr<const_deqp::gles3::Functional::(anonymous_namespace)::UniformCollection> *local_200;
  CallLogWrapper *local_1f8;
  deRandom local_1f0;
  Uniform local_1e0;
  VarType local_1a8 [4];
  ios_base local_138 [264];
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_00d06e90;
  iVar3 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  local_1f8 = &this->super_CallLogWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (local_1f8,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_00d06e90;
  dVar4 = randomFeatures(seed);
  *(deUint32 *)&(this->super_CallLogWrapper).field_0x14 = dVar4;
  deRandom_init(&local_1f0,seed);
  dVar4 = deRandom_getUint32(&local_1f0);
  local_224 = 0;
  this_01 = (UniformCollection *)operator_new(0x30);
  local_200 = &this->m_uniformCollection;
  local_228 = dVar4 % 5;
  (this_01->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = 0;
  local_238 = this;
  local_22c = seed;
  do {
    local_278.super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_278.super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,iVar3);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_220,0,(char *)0x0,0xb0de09);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_248 = *plVar8;
      lStack_240 = plVar6[3];
      local_258 = &local_248;
    }
    else {
      local_248 = *plVar8;
      local_258 = (long *)*plVar6;
    }
    name_ = local_258;
    local_250 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    glu::VarType::VarType(local_1a8);
    anon_unknown_1::Uniform::Uniform(&local_1e0,(char *)name_,local_1a8);
    glu::VarType::~VarType(local_1a8);
    if (local_258 != &local_248) {
      operator_delete(local_258,local_248 + 1);
    }
    if (local_220[0] != local_210) {
      operator_delete(local_220[0],local_210[0] + 1);
    }
    do {
      if (0 < (int)((ulong)((long)local_278.
                                  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_278.
                                 super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        lVar10 = 0;
        do {
          this_00 = local_278.
                    super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar10];
          if (this_00 != (StructType *)0x0) {
            glu::StructType::~StructType(this_00);
          }
          operator_delete(this_00,0x38);
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)((ulong)((long)local_278.
                                              super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_278.
                                             super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      if (local_278.
          super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_278.
          super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_278.
        super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_278.
             super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_220,0,(char *)0x0,0xb0de09);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_248 = *plVar8;
        lStack_240 = plVar6[3];
        local_258 = &local_248;
      }
      else {
        local_248 = *plVar8;
        local_258 = (long *)*plVar6;
      }
      local_250 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      generateRandomType(local_1a8,3,&local_224,&local_278,(Random *)&local_1f0);
      glu::VarType::operator=(&local_1e0.type,local_1a8);
      glu::VarType::~VarType(local_1a8);
      if (local_258 != &local_248) {
        operator_delete(local_258,local_248 + 1);
      }
      if (local_220[0] != local_210) {
        operator_delete(local_220[0],local_210[0] + 1);
      }
      pUVar1 = (this_01->m_uniforms).
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = (int)((long)(this_01->m_uniforms).
                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 3) *
              -0x49249249;
      if ((int)uVar9 < 1) {
        iVar12 = 0;
      }
      else {
        uVar11 = (ulong)(uVar9 & 0x7fffffff);
        type = &pUVar1->type;
        iVar12 = 0;
        do {
          iVar5 = getNumSamplersInType(type);
          iVar12 = iVar12 + iVar5;
          type = (VarType *)&type[2].m_data;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      iVar5 = getNumSamplersInType(&local_1e0.type);
      pUVar2 = local_238;
    } while (0x10 < iVar5 + iVar12);
    anon_unknown_1::UniformCollection::addUniform(this_01,&local_1e0);
    if (0 < (int)((ulong)((long)local_278.
                                super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_278.
                               super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      lVar10 = 0;
      do {
        anon_unknown_1::UniformCollection::addStructType
                  (this_01,local_278.
                           super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 < (int)((ulong)((long)local_278.
                                            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_278.
                                           super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3));
    }
    glu::VarType::~VarType(&local_1e0.type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0.name._M_dataplus._M_p != &local_1e0.name.field_2) {
      operator_delete(local_1e0.name._M_dataplus._M_p,
                      local_1e0.name.field_2._M_allocated_capacity + 1);
    }
    if (local_278.
        super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_278.
                      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_278.
                            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_278.
                            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 <= (int)local_228);
  (pUVar2->m_uniformCollection).m_state = (SharedPtrStateBase *)0x0;
  (pUVar2->m_uniformCollection).m_ptr = this_01;
  pSVar7 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar7->strongRefCount = 0;
  pSVar7->weakRefCount = 0;
  pSVar7->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d072e8;
  pSVar7[1]._vptr_SharedPtrStateBase = (_func_int **)this_01;
  (pUVar2->m_uniformCollection).m_state = pSVar7;
  pSVar7->strongRefCount = 1;
  pSVar7->weakRefCount = 1;
  deRandom_init((deRandom *)local_1a8,local_22c);
  dVar4 = deRandom_getUint32((deRandom *)local_1a8);
  pUVar2->m_caseShaderType = dVar4 % 3;
  (pUVar2->m_textures2d).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pUVar2->m_textures2d).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pUVar2->m_textures2d).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pUVar2->m_texturesCube).
  super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pUVar2->m_texturesCube).
  super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pUVar2->m_texturesCube).
  super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pUVar2->m_filledTextureUnits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pUVar2->m_filledTextureUnits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pUVar2->m_filledTextureUnits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

UniformCase::UniformCase (Context& context, const char* name, const char* description, const deUint32 seed)
	: TestCase				(context, name, description)
	, CallLogWrapper		(context.getRenderContext().getFunctions(), m_testCtx.getLog())
	, m_features			(randomFeatures(seed))
	, m_uniformCollection	(UniformCollection::random(seed))
	, m_caseShaderType		(randomCaseShaderType(seed))
{
}